

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O1

FiniteAutomaton *
Omega_h::FiniteAutomaton::maybe
          (FiniteAutomaton *__return_storage_ptr__,FiniteAutomaton *a,int token)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int to_state;
  int iVar4;
  long lVar5;
  int state;
  int iVar6;
  
  iVar3 = (a->table).ncols;
  bVar1 = a->is_deterministic;
  iVar2 = get_nrows<int>(&a->table);
  FiniteAutomaton(__return_storage_ptr__,iVar3 + (uint)bVar1 * 2 + -2,false,iVar2 + 2);
  iVar3 = add_state(__return_storage_ptr__);
  iVar2 = get_nrows<int>(&__return_storage_ptr__->table);
  append_states(__return_storage_ptr__,a);
  to_state = add_state(__return_storage_ptr__);
  if (__return_storage_ptr__->is_deterministic == true) {
    fail("assertion %s failed at %s +%d\n","!fa.is_deterministic",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
         ,0x1f);
  }
  iVar6 = (__return_storage_ptr__->table).ncols;
  add_transition(__return_storage_ptr__,iVar3,iVar6 + -1,iVar2);
  iVar6 = iVar6 + -2;
  lVar5 = 0;
  do {
    iVar4 = get_nrows<int>(&a->table);
    if (iVar4 <= lVar5) {
      add_transition(__return_storage_ptr__,iVar3,iVar6,to_state);
      add_accept(__return_storage_ptr__,to_state,token);
      return __return_storage_ptr__;
    }
    state = (int)lVar5;
    iVar4 = accepts(a,state);
    if (iVar4 != -1) {
      add_transition(__return_storage_ptr__,iVar3,iVar6,iVar2 + state);
      if (iVar2 + lVar5 < 0) {
        fail("assertion %s failed at %s +%d\n","0 <= i",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_std_vector.hpp"
             ,0x13);
      }
      (__return_storage_ptr__->accepted_tokens).super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar2 + lVar5] = -1;
      iVar3 = iVar2 + state;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

FiniteAutomaton FiniteAutomaton::maybe(FiniteAutomaton const& a, int token) {
  FiniteAutomaton out(get_nsymbols(a), false, get_nstates(a) + 2);
  auto new_start_state = add_state(out);
  auto offset = get_nstates(out);
  append_states(out, a);
  auto new_accept_state = add_state(out);
  auto epsilon0 = get_epsilon0(out);
  auto epsilon1 = get_epsilon1(out);
  add_transition(out, new_start_state, epsilon1, offset);
  /* form an epsilon0 linked list of new start state,
     all old accepting states, and new accepting state */
  auto last = new_start_state;
  for (int i = 0; i < get_nstates(a); ++i) {
    if (accepts(a, i) != -1) {
      add_transition(out, last, epsilon0, i + offset);
      remove_accept(out, i + offset);
      last = i + offset;
    }
  }
  add_transition(out, last, epsilon0, new_accept_state);
  add_accept(out, new_accept_state, token);
  return out;
}